

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O0

int __thiscall sznet::MinHeap<event>::erase(MinHeap<event> *this,event *e)

{
  event *e_00;
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  uint32_t parent_index;
  event *last;
  event *e_local;
  MinHeap<event> *this_local;
  
  if ((e->super_MinHeaBaseElem).min_heap_idx != -1) {
    uVar3 = this->m_size - 1;
    this->m_size = uVar3;
    e_00 = this->m_ptrArr[uVar3];
    uVar1 = parent(this,(e->super_MinHeaBaseElem).min_heap_idx);
    if (((e->super_MinHeaBaseElem).min_heap_idx < 1) ||
       (iVar2 = (*this->m_pCmpFunc)(this->m_ptrArr[uVar1],e_00), iVar2 != 1)) {
      shiftDown_(this,(e->super_MinHeaBaseElem).min_heap_idx,e_00);
    }
    else {
      shiftUp_(this,(e->super_MinHeaBaseElem).min_heap_idx,e_00);
    }
    (e->super_MinHeaBaseElem).min_heap_idx = -1;
    return 0;
  }
  return -1;
}

Assistant:

int erase(T* e)
	{
		if (-1 != e->min_heap_idx)
		{
			// 用最后的元素值替代被删除的结点
			T* last = m_ptrArr[--m_size];
			// 要删除元素的父亲元素下标
			uint32_t parent_index = parent(e->min_heap_idx);
			// 不是根节点 并且 要删除元素小于父结点，需要向上调整
			if (e->min_heap_idx > 0 && m_pCmpFunc(m_ptrArr[parent_index], last) == 1)
			{
				// 从删除元素的下标处向上给last找个合适的位置
				shiftUp_(e->min_heap_idx, last);
			}
			// 最后元素大于父结点，需要向下调整
			else
			{
				// 从删除元素的下标处向下给last找个合适的位置
				shiftDown_(e->min_heap_idx, last);
			}
			e->min_heap_idx = -1;

			return 0;
		}

		return -1;
	}